

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets_tests.cpp
# Opt level: O0

bool timeoffsets_tests::IsWarningRaised
               (vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                *check_offsets)

{
  long lVar1;
  byte bVar2;
  TimeOffsets *in_RDI;
  long in_FS_OFFSET;
  TimeOffsets offsets;
  Warnings warnings;
  TimeOffsets *in_stack_fffffffffffffee8;
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  Warnings *in_stack_ffffffffffffff10;
  Warnings *in_stack_ffffffffffffff28;
  TimeOffsets *in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::node::Warnings::Warnings(in_stack_ffffffffffffff28);
  TimeOffsets::TimeOffsets(in_RDI,in_stack_ffffffffffffff10);
  AddMulti((TimeOffsets *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
           in_stack_fffffffffffffef0);
  bVar2 = TimeOffsets::WarnIfOutOfSync(in_stack_ffffffffffffff58);
  TimeOffsets::~TimeOffsets(in_stack_fffffffffffffee8);
  ::node::Warnings::~Warnings((Warnings *)in_stack_fffffffffffffee8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool IsWarningRaised(const std::vector<std::chrono::seconds>& check_offsets)
{
    node::Warnings warnings{};
    TimeOffsets offsets{warnings};
    AddMulti(offsets, check_offsets);
    return offsets.WarnIfOutOfSync();
}